

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int graph_5_4::dfs(m_graph g,int v)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  code *pcVar7;
  m_graph *pmVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  code *pcVar11;
  int iVar12;
  byte bVar13;
  m_graph in_stack_fffffffffffffc70;
  m_graph in_stack_fffffffffffffe38;
  uint uStack_8;
  
  bVar13 = 0;
  piVar4 = &visited;
  (&visited)[v] = 1;
  iVar12 = 0;
  do {
    iVar2 = iVar12;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
    iVar12 = iVar2 + 1;
  } while (iVar1 != 0);
  pmVar8 = &g;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe38;
  for (lVar5 = 0x38; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *(undefined8 *)pmVar8->arc[0];
    pmVar8 = (m_graph *)(pmVar8->arc[0] + 2);
    puVar9 = puVar9 + 1;
  }
  dfs(in_stack_fffffffffffffe38,iVar2);
  uVar6 = 0;
  uVar3 = (ulong)uStack_8;
  if ((int)uStack_8 < 1) {
    uVar3 = uVar6;
  }
  piVar4 = &visited;
  for (; uVar3 * 4 != uVar6; uVar6 = uVar6 + 4) {
    *(undefined4 *)((long)&visited + uVar6) = 0;
  }
  iVar12 = 0;
  do {
    iVar2 = iVar12;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
    iVar12 = iVar2 + 1;
  } while (iVar1 != 0);
  puVar9 = (undefined8 *)&stack0xfffffffffffffe40;
  puVar10 = (undefined8 *)&stack0xfffffffffffffc70;
  for (lVar5 = 0x38; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
  }
  dfs(in_stack_fffffffffffffc70,iVar2);
  for (lVar5 = 1; lVar5 < 0x103446; lVar5 = lVar5 + 1) {
    *(undefined4 *)(&stack0xffffffffffbf2b28 + lVar5 * 4) =
         *(undefined4 *)(&stack0xfffffffffffffc78 + lVar5 * 4);
  }
  do {
    uVar3 = 0;
    iVar12 = -1;
    for (pcVar11 = (code *)0x1; pcVar11 != dfs_traverse; pcVar11 = pcVar11 + 1) {
      iVar1 = *(int *)(&stack0xffffffffffbf2b28 + (long)pcVar11 * 4);
      if (iVar1 != 0 && iVar1 < iVar12) {
        uVar3 = (ulong)pcVar11 & 0xffffffff;
        iVar12 = iVar1;
      }
      *(undefined4 *)(&stack0xffffffffffbf2b28 + (long)(int)uVar3 * 4) = 0;
      for (pcVar7 = (code *)0x1; pcVar7 != dfs_traverse; pcVar7 = pcVar7 + 1) {
        if ((*(int *)(&stack0xffffffffffbf2b28 + (long)pcVar7 * 4) != 0) &&
           (*(int *)(&stack0xfffffffffffffc78 + (long)pcVar7 * 4 + (long)(int)uVar3 * 0x28) <
            *(int *)(&stack0xffffffffffbf2b28 + (long)pcVar7 * 4))) {
          *(int *)(&stack0xffffffffffbf2b28 + (long)pcVar7 * 4) =
               *(int *)(&stack0xfffffffffffffc78 + (long)pcVar7 * 4 + (long)(int)uVar3 * 0x28);
        }
      }
    }
  } while( true );
}

Assistant:

int dfs(m_graph g, int v) {
        visited[v] = 1;
//        visit
        for (int i = 0; i < g.vnum; i++)
            if (visited[i] == 0)
                dfs(g, i);
    }